

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry,_kj::HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>_>
::insert(Table<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry,_kj::HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> *pRVar2
  ;
  RawBrandedSchema *pRVar3;
  RemoveConst<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> *pRVar4
  ;
  size_t sVar5;
  ArrayPtr<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry> table;
  HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>
  local_28 [16];
  
  pEVar1 = (this->rows).builder.ptr;
  sVar5 = (long)(this->rows).builder.pos - (long)pEVar1 >> 4;
  table.size_ = (size_t)pEVar1;
  table.ptr = (Entry *)&this->indexes;
  HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>::
  insert<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,capnp::_::RawSchema_const*&>
            (local_28,table,sVar5,(RawSchema **)sVar5);
  if (local_28[0] !=
      (HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>)0x1
     ) {
    pRVar4 = (this->rows).builder.pos;
    if (pRVar4 == (this->rows).builder.endPtr) {
      pRVar2 = (this->rows).builder.ptr;
      sVar5 = 4;
      if (pRVar4 != pRVar2) {
        sVar5 = (long)pRVar4 - (long)pRVar2 >> 3;
      }
      Vector<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>::
      setCapacity(&this->rows,sVar5);
      pRVar4 = (this->rows).builder.pos;
    }
    pRVar3 = row->value;
    pRVar4->key = row->key;
    pRVar4->value = pRVar3;
    pEVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar1 + 1;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }